

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void fts5IndexMergeLevel(Fts5Index *p,Fts5Structure **ppStruct,int iLvl,int *pnRem)

{
  int *pRc;
  sqlite3_stmt **ppStmt;
  Fts5Buffer *pBuf;
  ushort uVar1;
  uint nSegment;
  u32 nData;
  int iVar2;
  u8 *pData;
  Fts5StructureSegment *pFVar3;
  bool bVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  Fts5Iter *pFVar8;
  int iVar9;
  char *zSql;
  Fts5Data *p_00;
  int iLvl_00;
  Fts5SegIter *pFVar10;
  long lVar11;
  long lVar12;
  int in_R8D;
  Fts5StructureLevel *pFVar13;
  ulong uVar14;
  bool bVar15;
  Fts5StructureLevel *local_130;
  Fts5Buffer buf;
  int local_fc;
  Fts5Structure *local_f8;
  Fts5StructureSegment *local_e8;
  Fts5Iter *pIter;
  int local_d0;
  u8 local_cc [4];
  Fts5Buffer term;
  Fts5SegWriter writer;
  
  local_f8 = *ppStruct;
  local_130 = local_f8->aLevel + iLvl;
  pIter = (Fts5Iter *)0x0;
  if (pnRem == (int *)0x0) {
    local_fc = 0;
  }
  else {
    local_fc = *pnRem;
  }
  local_d0 = p->pConfig->eDetail;
  writer.btterm.p = (u8 *)0x0;
  writer.btterm.n = 0;
  writer.btterm.nSpace = 0;
  writer.nEmpty = 0;
  writer.nDlidx = 0;
  writer.aDlidx = (Fts5DlidxWriter *)0x0;
  writer.iPrevRowid = 0;
  writer.bFirstRowidInDoclist = '\0';
  writer.bFirstRowidInPage = '\0';
  writer.bFirstTermInPage = '\0';
  writer._75_1_ = 0;
  writer.nLeafWritten = 0;
  writer.writer.term.p = (u8 *)0x0;
  writer.writer.term.n = 0;
  writer.writer.term.nSpace = 0;
  writer.writer.pgidx.p = (u8 *)0x0;
  writer.writer.pgidx.n = 0;
  writer.writer.pgidx.nSpace = 0;
  writer.writer.buf.p = (u8 *)0x0;
  writer.writer.buf.n = 0;
  writer.writer.buf.nSpace = 0;
  writer.iSegid = 0;
  writer._4_4_ = 0;
  writer.writer.pgno = 0;
  writer.writer.iPrevPgidx = 0;
  writer.iBtPage = 0;
  writer._116_4_ = 0;
  term.p = (u8 *)0x0;
  term.n = 0;
  term.nSpace = 0;
  nSegment = local_130->nMerge;
  if (nSegment == 0) {
    iVar9 = fts5AllocateSegid(p,local_f8);
    if (local_f8->nLevel + -1 == iLvl) {
      fts5StructureAddLevel(&p->rc,ppStruct);
      local_f8 = *ppStruct;
    }
    iLvl_00 = iLvl + 1;
    fts5StructureExtendLevel(&p->rc,local_f8,iLvl_00,0,in_R8D);
    if (p->rc != 0) {
      return;
    }
    local_130 = local_f8->aLevel + iLvl;
    pFVar13 = local_f8->aLevel + iLvl_00;
    fts5WriteInit(p,&writer,iVar9);
    iVar2 = local_f8->aLevel[iLvl_00].nSeg;
    local_e8 = local_f8->aLevel[iLvl_00].aSeg + iVar2;
    local_f8->aLevel[iLvl_00].nSeg = iVar2 + 1;
    local_e8->pgnoFirst = 1;
    local_e8->iSegid = iVar9;
    local_f8->nSegment = local_f8->nSegment + 1;
    nSegment = local_f8->aLevel[iLvl].nSeg;
  }
  else {
    pFVar13 = (Fts5StructureLevel *)&local_f8[1].aLevel[(long)iLvl + -2].aSeg;
    local_e8 = (Fts5StructureSegment *)
               (*(long *)(local_f8[1].aLevel + (long)iLvl + -1) + -0xc +
               (long)*(int *)((long)&local_f8[1].aLevel[(long)iLvl + -2].aSeg + 4) * 0xc);
    fts5WriteInit(p,&writer,local_e8->iSegid);
    writer.writer.pgno = local_e8->pgnoLast + 1;
    writer._112_8_ = writer._112_8_ & 0xffffffff00000000;
  }
  if (pFVar13->nSeg == 1) {
    bVar15 = local_f8->nLevel == iLvl + 2;
  }
  else {
    bVar15 = false;
  }
  bVar5 = false;
  fts5MultiIterNew(p,local_f8,0x20,(Fts5Colset *)0x0,(u8 *)0x0,0,iLvl,nSegment,&pIter);
  pFVar8 = pIter;
  pRc = &p->rc;
  if (p->rc == 0) {
    while ((pFVar8->base).bEof == '\0') {
      uVar1 = pFVar8->aFirst[1].iFirst;
      nData = pFVar8->aSeg[uVar1].term.n;
      pData = pFVar8->aSeg[uVar1].term.p;
      if ((nData == term.n) &&
         ((nData == 0 || (iVar9 = bcmp(pData,term.p,(long)(int)nData), iVar9 == 0)))) {
LAB_001aca59:
        pFVar10 = pFVar8->aSeg + uVar1;
        if ((pFVar10->nPos != 0) || ((!bVar15 && (pFVar10->bDel != '\0')))) {
          if (*pRc == 0 && !bVar5) {
            fts5WriteAppendTerm(p,&writer,nData,pData);
            bVar5 = true;
          }
          pBuf = &writer.writer.buf;
          if (*pRc == 0) {
            lVar11 = pFVar8->aSeg[pFVar8->aFirst[1].iFirst].iRowid;
            if (p->pConfig->pgsz <= writer.writer.pgidx.n + writer.writer.buf.n) {
              fts5WriteFlushLeaf(p,&writer);
            }
            if (writer.bFirstRowidInPage != '\0') {
              *(ushort *)writer.writer.buf.p =
                   (ushort)writer.writer.buf.n << 8 | (ushort)writer.writer.buf.n >> 8;
              fts5WriteDlidxAppend(p,&writer,lVar11);
            }
            lVar12 = writer.iPrevRowid;
            if (writer.bFirstRowidInPage != '\0' || writer.bFirstRowidInDoclist != '\0') {
              lVar12 = 0;
            }
            sqlite3Fts5BufferAppendVarint(pRc,pBuf,lVar11 - lVar12);
            writer._72_8_ = writer._72_8_ & 0xffffffffffff0000;
            writer.iPrevRowid = lVar11;
          }
          if (local_d0 == 1) {
            if (pFVar10->bDel != '\0') {
              bVar4 = false;
              sqlite3Fts5BufferAppendVarint(pRc,pBuf,0);
              if (0 < pFVar10->nPos) {
                bVar4 = false;
                sqlite3Fts5BufferAppendVarint(pRc,pBuf,0);
              }
              goto LAB_001acbd9;
            }
          }
          else {
            sqlite3Fts5BufferAppendVarint(pRc,pBuf,(ulong)pFVar10->bDel + (long)pFVar10->nPos * 2);
            fts5ChunkIterate(p,pFVar10,&writer,fts5MergeChunkCallback);
          }
        }
        bVar4 = false;
      }
      else {
        if (pnRem == (int *)0x0) {
LAB_001aca35:
          term._8_8_ = term._8_8_ & 0xffffffff00000000;
          sqlite3Fts5BufferAppendBlob(pRc,&term,nData,pData);
          bVar5 = false;
          goto LAB_001aca59;
        }
        bVar4 = true;
        if (writer.nLeafWritten <= local_fc) goto LAB_001aca35;
      }
LAB_001acbd9:
      if ((bVar4) || (fts5MultiIterNext(p,pFVar8,0,0), p->rc != 0)) break;
    }
  }
  fts5WriteFinish(p,&writer,&local_e8->pgnoLast);
  pFVar8 = pIter;
  if ((p->rc == 0) && ((pIter->base).bEof == '\0')) {
    buf.p = (u8 *)0x0;
    buf.n = 0;
    buf.nSpace = 0;
    if (0 < pIter->nSeg) {
      pFVar10 = pIter->aSeg;
      lVar11 = 0;
      do {
        if (*pRc != 0) break;
        pFVar3 = pFVar10->pSeg;
        if (pFVar3 != (Fts5StructureSegment *)0x0) {
          if (pFVar10->pLeaf == (Fts5Data *)0x0) {
            pFVar3->pgnoFirst = 0;
            pFVar3->pgnoLast = 0;
          }
          else {
            iVar9 = pFVar10->iTermLeafOffset;
            local_cc[0] = '\0';
            local_cc[1] = '\0';
            local_cc[2] = '\0';
            local_cc[3] = '\0';
            uVar14 = (ulong)(uint)pFVar3->iSegid << 0x25;
            lVar12 = (long)pFVar10->iTermLeafPgno + uVar14;
            p_00 = fts5LeafRead(p,lVar12);
            uVar6 = buf._8_8_;
            if (p_00 != (Fts5Data *)0x0) {
              if (p_00->szLeaf < iVar9) {
                *pRc = 0x10b;
              }
              else {
                buf._8_8_ = buf._8_8_ & 0xffffffff00000000;
                uVar7 = buf._8_8_;
                buf.nSpace = SUB84(uVar6,4);
                bVar15 = (uint)buf.nSpace < (uint)p_00->nn;
                buf._8_8_ = uVar7;
                if (bVar15) {
                  sqlite3Fts5BufferSize(pRc,&buf,p_00->nn);
                }
                sqlite3Fts5BufferAppendBlob(pRc,&buf,4,local_cc);
                sqlite3Fts5BufferAppendVarint(pRc,&buf,(long)(pFVar10->term).n);
                sqlite3Fts5BufferAppendBlob(pRc,&buf,(pFVar10->term).n,(pFVar10->term).p);
                sqlite3Fts5BufferAppendBlob(pRc,&buf,p_00->szLeaf - iVar9,p_00->p + iVar9);
                if (*pRc == 0) {
                  *(ushort *)(buf.p + 2) = (ushort)buf.n << 8 | (ushort)buf.n >> 8;
                }
                sqlite3Fts5BufferAppendVarint(pRc,&buf,4);
                if (((pFVar10->iLeafPgno == pFVar10->iTermLeafPgno) &&
                    (pFVar10->iEndofDoclist < p_00->szLeaf)) && (pFVar10->iPgidxOff <= p_00->nn)) {
                  sqlite3Fts5BufferAppendVarint
                            (pRc,&buf,(long)((pFVar10->iEndofDoclist - p_00->szLeaf) + buf.n + -5));
                  sqlite3Fts5BufferAppendBlob
                            (pRc,&buf,p_00->nn - pFVar10->iPgidxOff,p_00->p + pFVar10->iPgidxOff);
                }
                pFVar10->pSeg->pgnoFirst = pFVar10->iTermLeafPgno;
                fts5DataDelete(p,uVar14 | 1,lVar12);
                fts5DataWrite(p,lVar12,buf.p,buf.n);
              }
              sqlite3_free(p_00);
            }
          }
        }
        lVar11 = lVar11 + 1;
        pFVar10 = pFVar10 + 1;
      } while (lVar11 < pFVar8->nSeg);
    }
    sqlite3_free(buf.p);
    local_130->nMerge = nSegment;
  }
  else {
    if (0 < (int)nSegment) {
      ppStmt = &p->pIdxDeleter;
      lVar11 = 0;
      do {
        iVar9 = *(int *)((long)&local_130->aSeg->iSegid + lVar11);
        fts5DataDelete(p,(long)iVar9 << 0x25,((ulong)(iVar9 + 1) << 0x25) + -1);
        if (p->pIdxDeleter == (sqlite3_stmt *)0x0) {
          zSql = sqlite3_mprintf("DELETE FROM \'%q\'.\'%q_idx\' WHERE segid=?",p->pConfig->zDb,
                                 p->pConfig->zName);
          fts5IndexPrepareStmt(p,ppStmt,zSql);
        }
        if (*pRc == 0) {
          sqlite3_bind_int64(*ppStmt,1,(long)iVar9);
          sqlite3_step(*ppStmt);
          iVar9 = sqlite3_reset(*ppStmt);
          *pRc = iVar9;
        }
        lVar11 = lVar11 + 0xc;
      } while ((ulong)nSegment * 0xc != lVar11);
    }
    iVar9 = local_130->nSeg - nSegment;
    if (iVar9 != 0) {
      memmove(local_130->aSeg,local_130->aSeg + (int)nSegment,(long)(iVar9 * 0xc));
    }
    iVar9 = local_f8->nSegment - nSegment;
    local_f8->nSegment = iVar9;
    local_130->nSeg = local_130->nSeg - nSegment;
    local_130->nMerge = 0;
    if (local_e8->pgnoLast == 0) {
      pFVar13->nSeg = pFVar13->nSeg + -1;
      local_f8->nSegment = iVar9 + -1;
    }
  }
  fts5MultiIterFree(pFVar8);
  sqlite3_free(term.p);
  if (pnRem != (int *)0x0) {
    *pnRem = *pnRem - writer.nLeafWritten;
  }
  return;
}

Assistant:

static void fts5IndexMergeLevel(
  Fts5Index *p,                   /* FTS5 backend object */
  Fts5Structure **ppStruct,       /* IN/OUT: Stucture of index */
  int iLvl,                       /* Level to read input from */
  int *pnRem                      /* Write up to this many output leaves */
){
  Fts5Structure *pStruct = *ppStruct;
  Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
  Fts5StructureLevel *pLvlOut;
  Fts5Iter *pIter = 0;       /* Iterator to read input data */
  int nRem = pnRem ? *pnRem : 0;  /* Output leaf pages left to write */
  int nInput;                     /* Number of input segments */
  Fts5SegWriter writer;           /* Writer object */
  Fts5StructureSegment *pSeg;     /* Output segment */
  Fts5Buffer term;
  int bOldest;                    /* True if the output segment is the oldest */
  int eDetail = p->pConfig->eDetail;
  const int flags = FTS5INDEX_QUERY_NOOUTPUT;
  int bTermWritten = 0;           /* True if current term already output */

  assert( iLvl<pStruct->nLevel );
  assert( pLvl->nMerge<=pLvl->nSeg );

  memset(&writer, 0, sizeof(Fts5SegWriter));
  memset(&term, 0, sizeof(Fts5Buffer));
  if( pLvl->nMerge ){
    pLvlOut = &pStruct->aLevel[iLvl+1];
    assert( pLvlOut->nSeg>0 );
    nInput = pLvl->nMerge;
    pSeg = &pLvlOut->aSeg[pLvlOut->nSeg-1];

    fts5WriteInit(p, &writer, pSeg->iSegid);
    writer.writer.pgno = pSeg->pgnoLast+1;
    writer.iBtPage = 0;
  }else{
    int iSegid = fts5AllocateSegid(p, pStruct);

    /* Extend the Fts5Structure object as required to ensure the output
    ** segment exists. */
    if( iLvl==pStruct->nLevel-1 ){
      fts5StructureAddLevel(&p->rc, ppStruct);
      pStruct = *ppStruct;
    }
    fts5StructureExtendLevel(&p->rc, pStruct, iLvl+1, 1, 0);
    if( p->rc ) return;
    pLvl = &pStruct->aLevel[iLvl];
    pLvlOut = &pStruct->aLevel[iLvl+1];

    fts5WriteInit(p, &writer, iSegid);

    /* Add the new segment to the output level */
    pSeg = &pLvlOut->aSeg[pLvlOut->nSeg];
    pLvlOut->nSeg++;
    pSeg->pgnoFirst = 1;
    pSeg->iSegid = iSegid;
    pStruct->nSegment++;

    /* Read input from all segments in the input level */
    nInput = pLvl->nSeg;
  }
  bOldest = (pLvlOut->nSeg==1 && pStruct->nLevel==iLvl+2);

  assert( iLvl>=0 );
  for(fts5MultiIterNew(p, pStruct, flags, 0, 0, 0, iLvl, nInput, &pIter);
      fts5MultiIterEof(p, pIter)==0;
      fts5MultiIterNext(p, pIter, 0, 0)
  ){
    Fts5SegIter *pSegIter = &pIter->aSeg[ pIter->aFirst[1].iFirst ];
    int nPos;                     /* position-list size field value */
    int nTerm;
    const u8 *pTerm;

    pTerm = fts5MultiIterTerm(pIter, &nTerm);
    if( nTerm!=term.n || fts5Memcmp(pTerm, term.p, nTerm) ){
      if( pnRem && writer.nLeafWritten>nRem ){
        break;
      }
      fts5BufferSet(&p->rc, &term, nTerm, pTerm);
      bTermWritten =0;
    }

    /* Check for key annihilation. */
    if( pSegIter->nPos==0 && (bOldest || pSegIter->bDel==0) ) continue;

    if( p->rc==SQLITE_OK && bTermWritten==0 ){
      /* This is a new term. Append a term to the output segment. */
      fts5WriteAppendTerm(p, &writer, nTerm, pTerm);
      bTermWritten = 1;
    }

    /* Append the rowid to the output */
    /* WRITEPOSLISTSIZE */
    fts5WriteAppendRowid(p, &writer, fts5MultiIterRowid(pIter));

    if( eDetail==FTS5_DETAIL_NONE ){
      if( pSegIter->bDel ){
        fts5BufferAppendVarint(&p->rc, &writer.writer.buf, 0);
        if( pSegIter->nPos>0 ){
          fts5BufferAppendVarint(&p->rc, &writer.writer.buf, 0);
        }
      }
    }else{
      /* Append the position-list data to the output */
      nPos = pSegIter->nPos*2 + pSegIter->bDel;
      fts5BufferAppendVarint(&p->rc, &writer.writer.buf, nPos);
      fts5ChunkIterate(p, pSegIter, (void*)&writer, fts5MergeChunkCallback);
    }
  }

  /* Flush the last leaf page to disk. Set the output segment b-tree height
  ** and last leaf page number at the same time.  */
  fts5WriteFinish(p, &writer, &pSeg->pgnoLast);

  if( fts5MultiIterEof(p, pIter) ){
    int i;

    /* Remove the redundant segments from the %_data table */
    for(i=0; i<nInput; i++){
      fts5DataRemoveSegment(p, pLvl->aSeg[i].iSegid);
    }

    /* Remove the redundant segments from the input level */
    if( pLvl->nSeg!=nInput ){
      int nMove = (pLvl->nSeg - nInput) * sizeof(Fts5StructureSegment);
      memmove(pLvl->aSeg, &pLvl->aSeg[nInput], nMove);
    }
    pStruct->nSegment -= nInput;
    pLvl->nSeg -= nInput;
    pLvl->nMerge = 0;
    if( pSeg->pgnoLast==0 ){
      pLvlOut->nSeg--;
      pStruct->nSegment--;
    }
  }else{
    assert( pSeg->pgnoLast>0 );
    fts5TrimSegments(p, pIter);
    pLvl->nMerge = nInput;
  }

  fts5MultiIterFree(pIter);
  fts5BufferFree(&term);
  if( pnRem ) *pnRem -= writer.nLeafWritten;
}